

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::DoAtomicRmwCmpxchg<unsigned_long,unsigned_long>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  bool bVar1;
  Store *this_00;
  Memory *this_01;
  Result RVar2;
  RunResult RVar3;
  ulong offset;
  Value VVar4;
  Value VVar5;
  Value VVar6;
  unsigned_long old;
  RefPtr<wabt::interp::Memory> local_98;
  Ptr *local_78;
  ulong local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  RefPtr<wabt::interp::Trap> local_48;
  
  local_78 = out_trap;
  RefPtr<wabt::interp::Memory>::RefPtr
            (&local_98,this->store_,
             (Ref)(this->inst_->memories_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start[instr.field_2.imm_u32].index);
  VVar4 = Pop(this);
  VVar5 = Pop(this);
  this_01 = local_98.obj_;
  bVar1 = ((local_98.obj_)->type_).limits.is_64;
  VVar6 = Pop(this);
  offset = (ulong)VVar6.field_0.i32_;
  if (bVar1 != false) {
    offset = VVar6.field_0.i64_;
  }
  RVar2 = Memory::AtomicRmwCmpxchg<unsigned_long>
                    (this_01,offset,(ulong)instr.field_2.imm_u32x2.snd,VVar5.field_0.i64_,
                     VVar4.field_0.i64_,&local_70);
  if (RVar2.enum_ == Error) {
    this_00 = this->store_;
    StringPrintf_abi_cxx11_
              (&local_68,"invalid atomic access at %lu+%u",offset,(ulong)instr.field_2.imm_u32x2.snd
              );
    Store::
    Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
              (&local_48,this_00,this_00,&local_68,&this->frames_);
    local_78->obj_ = local_48.obj_;
    local_78->store_ = local_48.store_;
    local_78->root_index_ = local_48.root_index_;
    local_48.obj_ = (Trap *)0x0;
    local_48.store_ = (Store *)0x0;
    local_48.root_index_ = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    RVar3 = Trap;
  }
  else {
    RVar3 = Ok;
    VVar4.field_0._8_8_ = 0;
    VVar4.field_0.i64_ = local_70;
    Push(this,VVar4);
  }
  if (local_98.obj_ != (Memory *)0x0) {
    Store::DeleteRoot(local_98.store_,local_98.root_index_);
  }
  return RVar3;
}

Assistant:

RunResult Thread::DoAtomicRmwCmpxchg(Instr instr, Trap::Ptr* out_trap) {
  Memory::Ptr memory{store_, inst_->memories()[instr.imm_u32x2.fst]};
  V replace = static_cast<V>(Pop<T>());
  V expect = static_cast<V>(Pop<T>());
  V old;
  u64 offset = PopPtr(memory);
  TRAP_IF(Failed(memory->AtomicRmwCmpxchg(offset, instr.imm_u32x2.snd, expect,
                                          replace, &old)),
          StringPrintf("invalid atomic access at %" PRIaddress "+%u", offset,
                       instr.imm_u32x2.snd));
  Push(static_cast<T>(old));
  return RunResult::Ok;
}